

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

StatusOr<google::protobuf::FeatureSet> * __thiscall
google::protobuf::FeatureResolver::MergeFeatures
          (StatusOr<google::protobuf::FeatureSet> *__return_storage_ptr__,FeatureResolver *this,
          FeatureSet *merged_parent,FeatureSet *unmerged_child)

{
  bool bVar1;
  Status local_90;
  Status _status;
  undefined1 local_78 [8];
  FeatureSet merged;
  FeatureSet *unmerged_child_local;
  FeatureSet *merged_parent_local;
  FeatureResolver *this_local;
  
  merged.field_0._56_8_ = unmerged_child;
  FeatureSet::FeatureSet((FeatureSet *)local_78,&this->defaults_);
  FeatureSet::MergeFrom((FeatureSet *)local_78,merged_parent);
  FeatureSet::MergeFrom((FeatureSet *)local_78,(FeatureSet *)merged.field_0._56_8_);
  anon_unknown_21::ValidateMergedFeatures((anon_unknown_21 *)&local_90,(FeatureSet *)local_78);
  bVar1 = absl::lts_20250127::Status::ok(&local_90);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::
    StatusOr<const_absl::lts_20250127::Status,_0>(__return_storage_ptr__,&local_90);
  }
  absl::lts_20250127::Status::~Status(&local_90);
  if (!bVar1) {
    absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::
    StatusOr<google::protobuf::FeatureSet,_0>(__return_storage_ptr__,(FeatureSet *)local_78);
  }
  FeatureSet::~FeatureSet((FeatureSet *)local_78);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSet> FeatureResolver::MergeFeatures(
    const FeatureSet& merged_parent, const FeatureSet& unmerged_child) const {
  FeatureSet merged = defaults_;
  merged.MergeFrom(merged_parent);
  merged.MergeFrom(unmerged_child);

  RETURN_IF_ERROR(ValidateMergedFeatures(merged));

  return merged;
}